

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O1

void __thiscall ki::protocol::net::ServerSession::on_keep_alive_response(ServerSession *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined1 auVar3 [16];
  long lVar4;
  ServerKeepAlive data;
  ServerKeepAlive local_20;
  
  p_Var1 = this->_vptr_ServerSession[-3];
  control::ServerKeepAlive::ServerKeepAlive(&local_20,0);
  control::ServerKeepAlive::read_from(&local_20,(istream *)(&this->field_0x40 + (long)p_Var1));
  lVar4 = std::chrono::_V2::steady_clock::now();
  pp_Var2 = this->_vptr_ServerSession;
  p_Var1 = pp_Var2[-3];
  auVar3 = SEXT816(lVar4 - *(long *)(&this->field_0x30 + (long)p_Var1)) *
           SEXT816(0x431bde82d7b634db);
  *(short *)(&this->field_0x3a + (long)p_Var1) =
       (short)(auVar3._8_8_ >> 0x12) - (auVar3._14_2_ >> 0xf);
  (&this->field_0x38)[(long)pp_Var2[-3]] = 0;
  return;
}

Assistant:

void ServerSession::on_keep_alive_response()
	{
		// Read the payload data into a structure
		try
		{
			// We don't actually need the data inside, but
			// read it to check if the structure is right.
			read_data<control::ServerKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE_RSP wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Calculate latency and allow for KEEP_ALIVE packets to be sent again
		m_latency = std::chrono::duration_cast<std::chrono::milliseconds>(
			std::chrono::steady_clock::now() - m_last_sent_heartbeat_time
			).count();
		m_waiting_for_keep_alive_response = false;
	}